

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

unsafe_optional_ptr<Node>
duckdb::GetChildInternal<duckdb::Node_const>(ART *art,Node *node,uint8_t byte)

{
  Node ptr;
  BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3> *n;
  Node48 *pNVar1;
  Node256 *pNVar2;
  BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4> *n_00;
  unsafe_optional_ptr<Node> uVar3;
  InternalException *this;
  Node *pNVar4;
  bool bVar5;
  allocator local_59;
  string local_58;
  string local_38;
  
  ptr = (Node)(node->super_IndexPointer).data;
  switch(ptr.super_IndexPointer.data._7_1_ & 0x7f) {
  case NODE_4:
    n = &Node::Ref<duckdb::Node4>(art,ptr,NODE_4)->
         super_BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3>;
    uVar3 = BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::GetChild(n,byte);
    return (unsafe_optional_ptr<Node>)uVar3.ptr;
  case NODE_16:
    n_00 = &Node::Ref<duckdb::Node16>(art,ptr,NODE_16)->
            super_BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4>;
    uVar3 = BaseNode<(unsigned_char)'\x10',_(duckdb::NType)4>::GetChild(n_00,byte);
    return (unsafe_optional_ptr<Node>)uVar3.ptr;
  case NODE_48:
    pNVar1 = Node::Ref<duckdb::Node48>(art,ptr,NODE_48);
    bVar5 = pNVar1->child_index[byte] == 0x30;
    pNVar4 = pNVar1->children + pNVar1->child_index[byte];
    break;
  case NODE_256:
    pNVar2 = Node::Ref<duckdb::Node256>(art,ptr,NODE_256);
    pNVar4 = pNVar2->children + byte;
    bVar5 = *(char *)((long)&pNVar2->children[byte].super_IndexPointer.data + 7) == '\0';
    break;
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Invalid node type for GetChildInternal: %s.",&local_59);
    EnumUtil::ToString<duckdb::NType>(&local_58,ptr.super_IndexPointer.data._7_1_ & 0x7f);
    InternalException::InternalException<std::__cxx11::string>(this,&local_38,&local_58);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  uVar3.ptr = (Node *)0x0;
  if (!bVar5) {
    uVar3.ptr = pNVar4;
  }
  return (unsafe_optional_ptr<Node>)uVar3.ptr;
}

Assistant:

void Node::Free(ART &art, Node &node) {
	if (!node.HasMetadata()) {
		return node.Clear();
	}

	// Free the children.
	auto type = node.GetType();
	switch (type) {
	case NType::PREFIX:
		return Prefix::Free(art, node);
	case NType::LEAF:
		return Leaf::DeprecatedFree(art, node);
	case NType::NODE_4:
		Node4::Free(art, node);
		break;
	case NType::NODE_16:
		Node16::Free(art, node);
		break;
	case NType::NODE_48:
		Node48::Free(art, node);
		break;
	case NType::NODE_256:
		Node256::Free(art, node);
		break;
	case NType::LEAF_INLINED:
		return node.Clear();
	case NType::NODE_7_LEAF:
	case NType::NODE_15_LEAF:
	case NType::NODE_256_LEAF:
		break;
	}

	GetAllocator(art, type).Free(node);
	node.Clear();
}